

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

void VP8IteratorExport(VP8EncIterator *it)

{
  WebPPicture *pWVar1;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  int iVar7;
  uint8_t *__dest;
  size_t __n;
  int iVar8;
  uint8_t *__dest_00;
  uint8_t *__dest_01;
  
  if (it->enc_->config_->show_compressed != 0) {
    iVar8 = it->x_;
    iVar5 = it->y_;
    puVar2 = it->yuv_out_;
    pWVar1 = it->enc_->pic_;
    iVar3 = (pWVar1->uv_stride * iVar5 + iVar8) * 8;
    __dest_01 = pWVar1->u + iVar3;
    __dest_00 = pWVar1->v + iVar3;
    iVar7 = pWVar1->width + iVar8 * -0x10;
    iVar3 = pWVar1->height + iVar5 * -0x10;
    if (0xf < iVar7) {
      iVar7 = 0x10;
    }
    iVar4 = 0x10;
    if (iVar3 < 0x10) {
      iVar4 = iVar3;
    }
    if (0 < iVar3) {
      iVar3 = pWVar1->y_stride;
      __dest = pWVar1->y + (iVar5 * iVar3 + iVar8) * 0x10;
      iVar8 = iVar4 + 1;
      puVar6 = puVar2;
      do {
        memcpy(__dest,puVar6,(long)iVar7);
        __dest = __dest + iVar3;
        puVar6 = puVar6 + 0x20;
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
    }
    iVar8 = iVar4 + 1 >> 1;
    if (0 < iVar8) {
      puVar6 = puVar2 + 0x10;
      puVar2 = puVar2 + 0x18;
      iVar3 = pWVar1->uv_stride;
      __n = (size_t)(iVar7 + 1 >> 1);
      iVar5 = iVar8 + 1;
      do {
        memcpy(__dest_01,puVar6,__n);
        __dest_01 = __dest_01 + iVar3;
        puVar6 = puVar6 + 0x20;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
      if (0 < iVar8) {
        iVar5 = pWVar1->uv_stride;
        iVar8 = iVar8 + 1;
        do {
          memcpy(__dest_00,puVar2,__n);
          __dest_00 = __dest_00 + iVar5;
          puVar2 = puVar2 + 0x20;
          iVar8 = iVar8 + -1;
        } while (1 < iVar8);
      }
    }
  }
  return;
}

Assistant:

void VP8IteratorExport(const VP8EncIterator* const it) {
  const VP8Encoder* const enc = it->enc_;
  if (enc->config_->show_compressed) {
    const int x = it->x_, y = it->y_;
    const uint8_t* const ysrc = it->yuv_out_ + Y_OFF_ENC;
    const uint8_t* const usrc = it->yuv_out_ + U_OFF_ENC;
    const uint8_t* const vsrc = it->yuv_out_ + V_OFF_ENC;
    const WebPPicture* const pic = enc->pic_;
    uint8_t* const ydst = pic->y + (y * pic->y_stride + x) * 16;
    uint8_t* const udst = pic->u + (y * pic->uv_stride + x) * 8;
    uint8_t* const vdst = pic->v + (y * pic->uv_stride + x) * 8;
    int w = (pic->width - x * 16);
    int h = (pic->height - y * 16);

    if (w > 16) w = 16;
    if (h > 16) h = 16;

    // Luma plane
    ExportBlock(ysrc, ydst, pic->y_stride, w, h);

    {   // U/V planes
      const int uv_w = (w + 1) >> 1;
      const int uv_h = (h + 1) >> 1;
      ExportBlock(usrc, udst, pic->uv_stride, uv_w, uv_h);
      ExportBlock(vsrc, vdst, pic->uv_stride, uv_w, uv_h);
    }
  }
}